

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O3

iterator * __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::begin(iterator *__return_storage_ptr__,
       concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
       *this)

{
  shared_ptr<std::unique_lock<tthread::fast_mutex>_> p;
  undefined1 local_29;
  unique_lock<tthread::fast_mutex> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::unique_lock<tthread::fast_mutex>,std::allocator<std::unique_lock<tthread::fast_mutex>>,tthread::fast_mutex&>
            (&local_20,&local_28,(allocator<std::unique_lock<tthread::fast_mutex>_> *)&local_29,
             &this->mutex_);
  (__return_storage_ptr__->it)._M_node =
       (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (__return_storage_ptr__->lock_ptr).
  super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  (__return_storage_ptr__->lock_ptr).
  super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_20._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator        begin()                 { auto p = std::make_shared<lock_guard<fast_mutex>>(mutex_); return iterator(map_.begin(), p); }